

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O0

shared_ptr<gui::Style> __thiscall gui::Theme::getStyle(Theme *this,String *widgetName)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mapped_type *this_00;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Style> sVar3;
  iterator styleIter;
  shared_ptr<gui::Style> *style;
  map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
  *in_stack_ffffffffffffff60;
  locale local_98 [8];
  locale *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffff78;
  string local_50 [39];
  undefined1 local_29;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
       ::find(in_stack_ffffffffffffff18,(key_type *)0x1dbe9a);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
       ::end(in_stack_ffffffffffffff18);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_> *)
               0x1dbee0);
    std::shared_ptr<gui::Style>::shared_ptr
              ((shared_ptr<gui::Style> *)in_stack_ffffffffffffff20,
               (shared_ptr<gui::Style> *)in_stack_ffffffffffffff18);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_29 = 0;
    (**(code **)(*in_RSI + 0x10))(in_RDI,in_RSI,local_18);
    bVar1 = std::operator==((shared_ptr<gui::Style> *)in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
    if (bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::locale::locale(local_98);
      sf::String::toAnsiString_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::operator+((char *)__lhs,in_stack_ffffffffffffff20);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff20);
      std::runtime_error::runtime_error((runtime_error *)__lhs,local_50);
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = std::
              map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
              ::operator[](in_stack_ffffffffffffff60,
                           (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                          );
    std::shared_ptr<gui::Style>::operator=
              (this_00,(shared_ptr<gui::Style> *)in_stack_ffffffffffffff18);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::Style>)sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> Theme::getStyle(const sf::String& widgetName) const {
    auto styleIter = styles_.find(widgetName);
    if (styleIter != styles_.end()) {
        return styleIter->second;
    }

    auto style = loadStyle(widgetName);
    if (style == nullptr) {
        throw std::runtime_error("theme failed to find style for \"" + widgetName.toAnsiString() + "\".");
    }
    styles_[widgetName] = style;
    return style;
}